

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausWriteIndClauses(Clu_Man_t *p)

{
  uint uVar1;
  Cnf_Dat_t *pCVar2;
  int *piVar3;
  int iVar4;
  int *pVar2Id;
  ulong uVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pDriver;
  Aig_Obj_t *p1;
  char *pFileName;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  size_t __size;
  
  pCVar2 = p->pCnf;
  iVar8 = pCVar2->nVars;
  __size = (long)iVar8 << 2;
  pVar2Id = (int *)malloc(__size);
  memset(pVar2Id,0xff,__size);
  pAVar6 = p->pAig;
  uVar1 = pAVar6->vObjs->nSize;
  uVar7 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar5 == uVar7) {
      pAVar6 = Aig_ManDupWithoutPos(pAVar6);
      piVar3 = p->vLitsProven->pArray;
      iVar8 = 0;
      for (iVar10 = 0; iVar10 < p->vClausesProven->nSize; iVar10 = iVar10 + 1) {
        iVar4 = Vec_IntEntry(p->vClausesProven,iVar10);
        lVar9 = (long)iVar8;
        pDriver = Fra_ClausGetLiteral(p,pVar2Id,piVar3[lVar9]);
        while (lVar9 = lVar9 + 1, lVar9 < iVar4) {
          p1 = Fra_ClausGetLiteral(p,pVar2Id,piVar3[lVar9]);
          pDriver = Aig_Or(pAVar6,pDriver,p1);
        }
        Aig_ObjCreateCo(pAVar6,pDriver);
        iVar8 = iVar4;
      }
      free(pVar2Id);
      Aig_ManCleanup(pAVar6);
      pFileName = Ioa_FileNameGenericAppend(p->pAig->pName,"_care.aig");
      printf("Care one-hotness clauses will be written into file \"%s\".\n",pFileName);
      Ioa_WriteAiger(pAVar6,pFileName,0,1);
      Aig_ManStop(pAVar6);
      return;
    }
    iVar10 = pCVar2->pVarNums[uVar7];
    if (-1 < (long)iVar10) {
      if (iVar8 <= iVar10) {
        __assert_fail("p->pCnf->pVarNums[i] < p->pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                      ,0x612,"void Fra_ClausWriteIndClauses(Clu_Man_t *)");
      }
      pVar2Id[iVar10] = (int)uVar7;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Fra_ClausWriteIndClauses( Clu_Man_t * p )
{ 
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
    Aig_Man_t * pNew;
    Aig_Obj_t * pClause, * pLiteral;
    char * pName;
    int * pStart, * pVar2Id; 
    int Beg, End, i, k;
    // create mapping from SAT vars to node IDs
    pVar2Id = ABC_ALLOC( int, p->pCnf->nVars );
    memset( pVar2Id, 0xFF, sizeof(int) * p->pCnf->nVars );
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        if ( p->pCnf->pVarNums[i] >= 0 )
        {
            assert( p->pCnf->pVarNums[i] < p->pCnf->nVars );
            pVar2Id[ p->pCnf->pVarNums[i] ] = i;
        }
    // start the manager
    pNew = Aig_ManDupWithoutPos( p->pAig );
    // add the clauses
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        pClause = Fra_ClausGetLiteral( p, pVar2Id, pStart[Beg] );
        for ( k = Beg + 1; k < End; k++ )
        {
            pLiteral = Fra_ClausGetLiteral( p, pVar2Id, pStart[k] );
            pClause = Aig_Or( pNew, pClause, pLiteral );
        }
        Aig_ObjCreateCo( pNew, pClause );
        Beg = End;
    }
    ABC_FREE( pVar2Id );
    Aig_ManCleanup( pNew );
    pName = Ioa_FileNameGenericAppend( p->pAig->pName, "_care.aig" );
    printf( "Care one-hotness clauses will be written into file \"%s\".\n", pName );
    Ioa_WriteAiger( pNew, pName, 0, 1 );
    Aig_ManStop( pNew );
}